

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int imcomp_convert_tile_tdouble
              (fitsfile *outfptr,long row,void *tiledata,long tilelen,long tilenx,long tileny,
              int nullcheck,void *nullflagval,int nullval,int zbitpix,double scale,double zero,
              int *intlength,int *flag,double *bscale,double *bzero,int *status)

{
  float fVar1;
  int iVar2;
  time_t tVar3;
  ulong uVar4;
  long in_RCX;
  double *in_RDX;
  double unaff_RBX;
  long in_RDI;
  undefined8 unaff_R14;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  long unaff_retaddr;
  int in_stack_00000008;
  undefined4 in_stack_0000000c;
  double *in_stack_00000010;
  int in_stack_00000018;
  undefined4 in_stack_0000001c;
  int in_stack_00000020;
  undefined4 *in_stack_00000028;
  int *in_stack_00000030;
  int imaxval;
  int iminval;
  unsigned_long dithersum;
  uchar *usbbuff;
  double doublenull;
  long ii;
  long irow;
  int *idata;
  char *in_stack_ffffffffffffff38;
  void *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  int datatype;
  fitsfile *in_stack_ffffffffffffff58;
  ulong local_88;
  long local_70;
  int in_stack_ffffffffffffffe8;
  float in_stack_ffffffffffffffec;
  
  iVar2 = (int)((ulong)unaff_R14 >> 0x20);
  datatype = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  if (((((in_stack_00000020 != 0x20) && (in_stack_00000020 != -0x40)) &&
       (in_stack_00000020 != -0x20)) || ((in_XMM0_Qa != 1.0 || (NAN(in_XMM0_Qa))))) ||
     ((in_XMM1_Qa != 0.0 || (NAN(in_XMM1_Qa))))) {
    ffpmsg((char *)0x1ef87e);
    usbbuff[0] = 0x9d;
    usbbuff[1] = '\x01';
    usbbuff[2] = '\0';
    usbbuff[3] = '\0';
    iVar2 = 0x19d;
  }
  else {
    *in_stack_00000028 = 4;
    if (*(int *)(*(long *)(in_RDI + 8) + 0x4e4) < 1) {
      fVar1 = *(float *)(*(long *)(in_RDI + 8) + 0x470);
      if ((fVar1 != 9999.0) || (NAN(fVar1))) {
        if ((in_XMM0_Qa != 1.0) || (((NAN(in_XMM0_Qa) || (in_XMM1_Qa != 0.0)) || (NAN(in_XMM1_Qa))))
           ) {
          imcomp_nullscaledoubles
                    (in_RDX,in_RCX,(int *)in_RDX,in_XMM0_Qa,in_XMM1_Qa,in_stack_00000008,
                     *in_stack_00000010,in_stack_00000018,(int *)usbbuff);
        }
        else {
          imcomp_nulldoubles(in_RDX,in_RCX,(int *)in_RDX,in_stack_00000008,*in_stack_00000010,
                             in_stack_00000018,(int *)usbbuff);
        }
      }
      else {
        fVar1 = *(float *)(*(long *)(in_RDI + 8) + 0x470);
        if (((fVar1 == 9999.0) && (!NAN(fVar1))) && (in_stack_00000008 == 1)) {
          imcomp_double2nan(in_RDX,in_RCX,(LONGLONG *)in_RDX,*in_stack_00000010,(int *)usbbuff);
        }
      }
    }
    else {
      if ((*(int *)(*(long *)(in_RDI + 8) + 0x474) == 1) ||
         (*(int *)(*(long *)(in_RDI + 8) + 0x474) == 2)) {
        if ((*(int *)(*(long *)(in_RDI + 8) + 0x428) == 0) &&
           (*(int *)(*(long *)(in_RDI + 8) + 0x478) == 0)) {
          tVar3 = time((time_t *)0x0);
          uVar4 = clock();
          *(int *)(*(long *)(in_RDI + 8) + 0x478) =
               ((int)tVar3 +
                (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) / 10000
                     ) + *(int *)(*(long *)(in_RDI + 8) + 0x54)) % 10000 + 1;
          ffuky(in_stack_ffffffffffffff58,datatype,in_stack_ffffffffffffff48,
                in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,(int *)0x1ef9e3);
        }
        else if ((*(int *)(*(long *)(in_RDI + 8) + 0x428) < 0) &&
                (*(int *)(*(long *)(in_RDI + 8) + 0x478) < 0)) {
          local_88 = 0;
          for (local_70 = 0; local_70 < in_RCX * 8; local_70 = local_70 + 1) {
            local_88 = *(byte *)((long)in_RDX + local_70) + local_88;
          }
          *(int *)(*(long *)(in_RDI + 8) + 0x478) = (int)(local_88 % 10000) + 1;
          ffuky(in_stack_ffffffffffffff58,datatype,in_stack_ffffffffffffff48,
                in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,(int *)0x1efad6);
        }
      }
      else if (*(int *)(*(long *)(in_RDI + 8) + 0x474) != -1) {
        ffpmsg((char *)0x1efb2d);
        ffpmsg((char *)0x1efb39);
        usbbuff[0] = 0x9d;
        usbbuff[1] = '\x01';
        usbbuff[2] = '\0';
        usbbuff[3] = '\0';
        return 0x19d;
      }
      iVar2 = fits_quantize_double
                        (CONCAT44(in_stack_0000001c,in_stack_00000018),in_stack_00000010,
                         CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr,iVar2,unaff_RBX
                         ,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,(int *)dithersum,
                         (double *)usbbuff,(double *)doublenull,(int *)ii,(int *)irow);
      *in_stack_00000030 = iVar2;
      if (1 < *in_stack_00000030) {
        iVar2 = *in_stack_00000030;
        *(int *)usbbuff = iVar2;
        return iVar2;
      }
    }
    iVar2 = *(int *)usbbuff;
  }
  return iVar2;
}

Assistant:

int imcomp_convert_tile_tdouble(
    fitsfile *outfptr,
    long row,
    void *tiledata, 
    long tilelen,
    long tilenx,
    long tileny,
    int nullcheck,
    void *nullflagval,
    int nullval,
    int zbitpix,
    double scale,
    double zero,
    int *intlength,
    int *flag,
    double *bscale,
    double *bzero,
    int *status)
{
    /*  Prepare the input tile array of pixels for compression. */
    /*  Convert input double tile array in place to 4-byte ints for compression, */
    /*  If needed, convert 4 or 8-byte ints and do null value substitution. */
    /*  Note that the calling routine must have allocated the input array big enough */
    /* to be able to do this.  */

    int *idata;
    long irow, ii;
    double doublenull;
    unsigned char *usbbuff;
    unsigned long dithersum;
    int iminval = 0, imaxval = 0;  /* min and max quantized integers */

        /* datatype of input array is double.  We only support writing this datatype
           to a FITS image with BITPIX = -64 or -32, except we also support the special case where
	   BITPIX = 32 and BZERO = 0 and BSCALE = 1.  */

       if ((zbitpix != LONG_IMG && zbitpix != DOUBLE_IMG && zbitpix != FLOAT_IMG) || scale != 1.0 || zero != 0.) {
           ffpmsg("Implicit datatype conversion is not supported when writing to compressed images");
           return(*status = DATA_COMPRESSION_ERR);
       } 

           *intlength = 4;
           idata = (int *) tiledata;

          /* if the tile-compressed table contains zscale and zzero columns */
          /* then scale and quantize the input floating point data.    */
          /* Otherwise, just truncate the floats to integers.          */

          if ((outfptr->Fptr)->cn_zscale > 0)
          {
            if (nullcheck == 1)
	      doublenull = *(double *) (nullflagval);
	    else
	      doublenull = DOUBLENULLVALUE;

            /* quantize the double values into integers */
              if ((outfptr->Fptr)->quantize_method == SUBTRACTIVE_DITHER_1 ||
	          (outfptr->Fptr)->quantize_method == SUBTRACTIVE_DITHER_2) {

	          /* see if the dithering offset value needs to be initialized (see above) */                  
	          if ((outfptr->Fptr)->request_dither_seed == 0 && (outfptr->Fptr)->dither_seed == 0) {

		     (outfptr->Fptr)->dither_seed = 
		       (( (int)time(NULL) + ( (int) clock() / (int) (CLOCKS_PER_SEC / 100)) + (outfptr->Fptr)->curhdu) % 10000) + 1;
		     
                     /* update the header keyword with this new value */
		     fits_update_key(outfptr, TINT, "ZDITHER0", &((outfptr->Fptr)->dither_seed), 
	                        NULL, status);

	          } else if ((outfptr->Fptr)->request_dither_seed < 0 && (outfptr->Fptr)->dither_seed < 0) {

		     usbbuff = (unsigned char *) tiledata;
		     dithersum = 0;
		     for (ii = 0; ii < 8 * tilelen; ii++) {
		         dithersum += usbbuff[ii];
	             }
		     (outfptr->Fptr)->dither_seed = ((int) (dithersum % 10000)) + 1;
		
                     /* update the header keyword with this new value */
		     fits_update_key(outfptr, TINT, "ZDITHER0", &((outfptr->Fptr)->dither_seed), 
	                        NULL, status);
		  }

	          irow = row + (outfptr->Fptr)->dither_seed - 1; /* dither the quantized values */

	      } else if ((outfptr->Fptr)->quantize_method == -1) {
	          irow = 0;  /* do not dither the quantized values */
              } else {
                  ffpmsg("Unknown subtractive dithering method.");
                  ffpmsg("May need to install a newer version of CFITSIO.");
                  return(*status = DATA_COMPRESSION_ERR);
              }

            *flag = fits_quantize_double (irow, (double *) tiledata, tilenx, tileny,
               nullcheck, doublenull, (outfptr->Fptr)->quantize_level, 
	       (outfptr->Fptr)->quantize_method, idata,
               bscale, bzero, &iminval, &imaxval);

            if (*flag > 1)
		return(*status = *flag);
          }
          else if ((outfptr->Fptr)->quantize_level != NO_QUANTIZE)
	  {
	    /* if floating point pixels are not being losslessly compressed, then */
	    /* input float data is implicitly converted (truncated) to integers */
             if ((scale != 1. || zero != 0.))  /* must scale the values */
	       imcomp_nullscaledoubles((double *) tiledata, tilelen, idata, scale, zero,
	           nullcheck, *(double *) (nullflagval), nullval, status);
             else
	       imcomp_nulldoubles((double *) tiledata, tilelen, idata,
	           nullcheck, *(double *) (nullflagval), nullval,  status);
          }
          else if ((outfptr->Fptr)->quantize_level == NO_QUANTIZE)
	  {
	      /* just convert null values to NaNs in place, if necessary, then do lossless gzip compression */
		if (nullcheck == 1) {
	            imcomp_double2nan((double *) tiledata, tilelen, (LONGLONG *) tiledata,
	                *(double *) (nullflagval), status);
		}
          }
 
          return(*status);
}